

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O0

int __thiscall zmq::dish_t::xxrecv(dish_t *this,msg_t *msg_)

{
  ssize_t sVar1;
  key_type *__x;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  msg_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int rc;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  do {
    sVar1 = fq_t::recv((fq_t *)(in_RDI + 0x6e8),(int)in_RSI,in_RDX,in_RCX,in_R8D);
    if ((int)sVar1 != 0) {
      return -1;
    }
    __x = (key_type *)(in_RDI + 0x758);
    this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)msg_t::group(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    in_RCX = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::count(this_00,__x);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
    in_RDX = extraout_RDX;
  } while (in_RCX == 0);
  return 0;
}

Assistant:

int zmq::dish_t::xxrecv (msg_t *msg_)
{
    do {
        //  Get a message using fair queueing algorithm.
        const int rc = _fq.recv (msg_);

        //  If there's no message available, return immediately.
        //  The same when error occurs.
        if (rc != 0)
            return -1;

        //  Skip non matching messages
    } while (0 == _subscriptions.count (std::string (msg_->group ())));

    //  Found a matching message
    return 0;
}